

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  uint *puVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  ostringstream os;
  ulong *local_288;
  size_type local_280;
  ulong local_278;
  undefined8 uStack_270;
  string local_268;
  ulong *local_248;
  undefined8 local_240;
  ulong local_238;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  ulong *local_228;
  size_type local_220;
  ulong local_218;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  bool local_208;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  ulong *local_1e0;
  size_type local_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined8 local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  pcVar4 = *(char **)this;
  cVar2 = *pcVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[optional:",10);
  cVar3 = *pcVar4;
  if (cVar3 == '\x01') {
    to_string<(anonymous_namespace)::Explicit>(&local_268,(Explicit *)(pcVar4 + 4));
    local_288 = &local_278;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == &local_268.field_2) {
      uStack_270 = local_268.field_2._8_8_;
    }
    else {
      local_288 = (ulong *)local_268._M_dataplus._M_p;
    }
    local_280 = local_268._M_string_length;
  }
  else {
    local_1c0 = &local_1b0;
    local_1b0._M_allocated_capacity._1_2_ = 0x6d65;
    local_1b0._M_allocated_capacity._3_4_ = 0x5d797470;
    local_1b0._M_local_buf[7] = '\0';
    local_268.field_2._M_allocated_capacity = 0x5d7974706d655b;
    local_268.field_2._8_8_ = local_1b0._8_8_;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    local_288 = &local_278;
    uStack_270 = local_1b0._8_8_;
    local_280 = 7;
  }
  local_278 = local_268.field_2._M_allocated_capacity;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_288,local_280);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (cVar3 == '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0 == &local_1b0) goto LAB_001f6915;
    uVar6 = CONCAT17(local_1b0._M_local_buf[7],
                     CONCAT43(local_1b0._M_allocated_capacity._3_4_,
                              CONCAT21(local_1b0._M_allocated_capacity._1_2_,
                                       local_1b0._M_local_buf[0])));
    _Var7._M_p = (pointer)local_1c0;
  }
  else {
    uVar6 = local_268.field_2._M_allocated_capacity;
    _Var7._M_p = local_268._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == &local_268.field_2) goto LAB_001f6915;
  }
  operator_delete(_Var7._M_p,uVar6 + 1);
LAB_001f6915:
  std::__cxx11::ostringstream::str();
  if (local_288 == &local_278) {
    uStack_1c8 = uStack_270;
    local_1e0 = &local_1d0;
  }
  else {
    local_1e0 = local_288;
  }
  local_1d0 = local_278;
  local_1d8 = local_280;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_1e0 == &local_1d0) {
    uStack_230 = (undefined4)uStack_1c8;
    uStack_22c = uStack_1c8._4_4_;
    local_248 = &local_238;
  }
  else {
    local_248 = local_1e0;
  }
  if (local_248 == &local_238) {
    uStack_210 = uStack_230;
    uStack_20c = uStack_22c;
    local_228 = &local_218;
  }
  else {
    local_228 = local_248;
  }
  local_218 = local_1d0;
  local_220 = local_1d8;
  local_240 = 0;
  local_238 = local_1d0 & 0xffffffffffffff00;
  local_248 = &local_238;
  local_208 = (bool)cVar2;
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_228,(long)local_228 + local_1d8);
  __return_storage_ptr__->passed = local_208;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_200,local_1f8 + (long)local_200)
  ;
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }